

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrfac.c
# Opt level: O3

void qrfac(int m,int n,double *a,int lda,int pivot,int *ipvt,int lipvt,double *rdiag,double *acnorm,
          double *wa)

{
  double *x;
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  double *pdVar11;
  double *pdVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  ulong local_a0;
  double *local_98;
  
  uVar2 = (ulong)(uint)n;
  dVar14 = dpmpar(1);
  lVar5 = (long)lda;
  if (0 < n) {
    uVar10 = 0;
    pdVar11 = a;
    do {
      dVar15 = enorm(m,pdVar11);
      acnorm[uVar10] = dVar15;
      rdiag[uVar10] = dVar15;
      wa[uVar10] = dVar15;
      if (pivot != 0) {
        ipvt[uVar10] = (int)uVar10 + 1;
      }
      uVar10 = uVar10 + 1;
      pdVar11 = pdVar11 + lVar5;
    } while (uVar2 != uVar10);
  }
  uVar3 = n;
  if (m < n) {
    uVar3 = m;
  }
  if (0 < (int)uVar3) {
    local_98 = a + lVar5;
    local_a0 = 1;
    pdVar11 = a;
    uVar10 = 0;
    pdVar12 = a;
    uVar13 = (ulong)(uint)m;
    do {
      if (pivot != 0) {
        uVar6 = uVar10 & 0xffffffff;
        uVar8 = uVar10;
        do {
          uVar4 = (uint)uVar8;
          if (rdiag[uVar8] < rdiag[(int)(uint)uVar6] || rdiag[uVar8] == rdiag[(int)(uint)uVar6]) {
            uVar4 = (uint)uVar6;
          }
          uVar8 = uVar8 + 1;
          uVar6 = (ulong)uVar4;
        } while (uVar2 != uVar8);
        if (uVar10 != uVar4) {
          uVar8 = 0;
          do {
            dVar15 = pdVar11[uVar8];
            pdVar11[uVar8] = a[(long)(int)(uVar4 * lda) + uVar8];
            a[(long)(int)(uVar4 * lda) + uVar8] = dVar15;
            uVar8 = uVar8 + 1;
          } while ((uint)m != uVar8);
          rdiag[(int)uVar4] = rdiag[uVar10];
          wa[(int)uVar4] = wa[uVar10];
          iVar1 = ipvt[uVar10];
          ipvt[uVar10] = ipvt[(int)uVar4];
          ipvt[(int)uVar4] = iVar1;
        }
      }
      uVar8 = uVar10 + 1;
      iVar1 = m - (int)uVar8;
      x = a + uVar10 + (long)((int)uVar10 * lda);
      dVar15 = enorm(iVar1 + 1,x);
      if ((dVar15 != 0.0) || (NAN(dVar15))) {
        dVar15 = (double)(~-(ulong)(*x < 0.0) & (ulong)dVar15 | (ulong)-dVar15 & -(ulong)(*x < 0.0))
        ;
        uVar6 = 0;
        do {
          pdVar12[uVar6] = pdVar12[uVar6] / dVar15;
          uVar6 = uVar6 + 1;
        } while (uVar13 != uVar6);
        *x = *x + 1.0;
        pdVar9 = local_98;
        uVar6 = local_a0;
        if ((long)uVar8 < (long)n) {
          do {
            dVar16 = 0.0;
            uVar7 = 0;
            do {
              dVar16 = dVar16 + pdVar12[uVar7] * pdVar9[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar13 != uVar7);
            dVar17 = *x;
            uVar7 = 0;
            do {
              pdVar9[uVar7] = pdVar12[uVar7] * (-dVar16 / dVar17) + pdVar9[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar13 != uVar7);
            if (pivot != 0) {
              dVar16 = rdiag[uVar6];
              if ((dVar16 != 0.0) || (NAN(dVar16))) {
                dVar17 = 1.0 - (a[uVar10 + uVar6 * lVar5] / dVar16) *
                               (a[uVar10 + uVar6 * lVar5] / dVar16);
                dVar16 = SQRT((double)(~-(ulong)(dVar17 <= 0.0) & (ulong)dVar17)) * dVar16;
                rdiag[uVar6] = dVar16;
                dVar16 = dVar16 / wa[uVar6];
                if (dVar16 * dVar16 * 0.05 <= dVar14) {
                  dVar16 = enorm(iVar1,a + uVar8 + uVar6 * lVar5);
                  rdiag[uVar6] = dVar16;
                  wa[uVar6] = dVar16;
                }
              }
            }
            uVar6 = uVar6 + 1;
            pdVar9 = pdVar9 + lVar5;
          } while (uVar6 != uVar2);
        }
      }
      rdiag[uVar10] = -dVar15;
      local_a0 = local_a0 + 1;
      pdVar11 = pdVar11 + lVar5;
      pdVar12 = pdVar12 + lVar5 + 1;
      uVar13 = uVar13 - 1;
      local_98 = local_98 + lVar5 + 1;
      uVar10 = uVar8;
    } while (uVar8 != uVar3);
  }
  return;
}

Assistant:

__cminpack_attr__
void __cminpack_func__(qrfac)(int m, int n, real *a, int
	lda, int pivot, int *ipvt, int lipvt, real *rdiag,
	 real *acnorm, real *wa)
{
#ifdef USE_LAPACK
    __CLPK_integer m_ = m;
    __CLPK_integer n_ = n;
    __CLPK_integer lda_ = lda;
    __CLPK_integer *jpvt;

    int i, j, k;
    real t;
    real* tau = wa;
    const __CLPK_integer ltau = m > n ? n : m;
    __CLPK_integer lwork = -1;
    __CLPK_integer info = 0;
    real* work;

    if (pivot) {
        assert( lipvt >= n );
        if (sizeof(__CLPK_integer) != sizeof(ipvt[0])) {
            jpvt = malloc(n*sizeof(__CLPK_integer));
        } else {
            /* __CLPK_integer is actually an int, just do a cast */
            jpvt = (__CLPK_integer *)ipvt;
        }
        /* set all columns free */
        memset(jpvt, 0, sizeof(int)*n);
    }
    
    /* query optimal size of work */
    lwork = -1;
    if (pivot) {
        __cminpack_lapack__(geqp3_)(&m_,&n_,a,&lda_,jpvt,tau,tau,&lwork,&info);
        lwork = (int)tau[0];
        assert( lwork >= 3*n+1  );
    } else {
        __cminpack_lapack__(geqrf_)(&m_,&n_,a,&lda_,tau,tau,&lwork,&info);
        lwork = (int)tau[0];
        assert( lwork >= 1 && lwork >= n );
    }
    
    assert( info == 0 );
    
    /* alloc work area */
    work = (real *)malloc(sizeof(real)*lwork);
    assert(work != NULL);
    
    /* set acnorm first (from the doc of qrfac, acnorm may point to the same area as rdiag) */
    if (acnorm != rdiag) {
        for (j = 0; j < n; ++j) {
            acnorm[j] = __cminpack_func__(enorm)(m, &a[j * lda]);
        }
    }
    
    /* QR decomposition */
    if (pivot) {
        __cminpack_lapack__(geqp3_)(&m_,&n_,a,&lda_,jpvt,tau,work,&lwork,&info);
    } else {
        __cminpack_lapack__(geqrf_)(&m_,&n_,a,&lda_,tau,work,&lwork,&info);
    }
    assert(info == 0);
    
    /* set rdiag, before the diagonal is replaced */
    memset(rdiag, 0, sizeof(real)*n);
    for(i=0 ; i<n ; ++i) {
        rdiag[i] = a[i*lda+i];
    }
    
    /* modify lower trinagular part to look like qrfac's output */
    for(i=0 ; i<ltau ; ++i) {
        k = i*lda+i;
        t = tau[i];
        a[k] = t;
        for(j=i+1 ; j<m ; j++) {
            k++;
            a[k] *= t;
        }
    }
    
    free(work);
    if (pivot) {
        /* convert back jpvt to ipvt */
        if (sizeof(__CLPK_integer) != sizeof(ipvt[0])) {
            for(i=0; i<n; ++i) {
                ipvt[i] = jpvt[i];
            }
            free(jpvt);
        }
    }
#else /* !USE_LAPACK */
    /* Initialized data */

#define p05 .05

    /* System generated locals */
    real d1;

    /* Local variables */
    int i, j, k, jp1;
    real sum;
    real temp;
    int minmn;
    real epsmch;
    real ajnorm;

/*     ********** */

/*     subroutine qrfac */

/*     this subroutine uses householder transformations with column */
/*     pivoting (optional) to compute a qr factorization of the */
/*     m by n matrix a. that is, qrfac determines an orthogonal */
/*     matrix q, a permutation matrix p, and an upper trapezoidal */
/*     matrix r with diagonal elements of nonincreasing magnitude, */
/*     such that a*p = q*r. the householder transformation for */
/*     column k, k = 1,2,...,min(m,n), is of the form */

/*                           t */
/*           i - (1/u(k))*u*u */

/*     where u has zeros in the first k-1 positions. the form of */
/*     this transformation and the method of pivoting first */
/*     appeared in the corresponding linpack subroutine. */

/*     the subroutine statement is */

/*       subroutine qrfac(m,n,a,lda,pivot,ipvt,lipvt,rdiag,acnorm,wa) */

/*     where */

/*       m is a positive integer input variable set to the number */
/*         of rows of a. */

/*       n is a positive integer input variable set to the number */
/*         of columns of a. */

/*       a is an m by n array. on input a contains the matrix for */
/*         which the qr factorization is to be computed. on output */
/*         the strict upper trapezoidal part of a contains the strict */
/*         upper trapezoidal part of r, and the lower trapezoidal */
/*         part of a contains a factored form of q (the non-trivial */
/*         elements of the u vectors described above). */

/*       lda is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array a. */

/*       pivot is a logical input variable. if pivot is set true, */
/*         then column pivoting is enforced. if pivot is set false, */
/*         then no column pivoting is done. */

/*       ipvt is an integer output array of length lipvt. ipvt */
/*         defines the permutation matrix p such that a*p = q*r. */
/*         column j of p is column ipvt(j) of the identity matrix. */
/*         if pivot is false, ipvt is not referenced. */

/*       lipvt is a positive integer input variable. if pivot is false, */
/*         then lipvt may be as small as 1. if pivot is true, then */
/*         lipvt must be at least n. */

/*       rdiag is an output array of length n which contains the */
/*         diagonal elements of r. */

/*       acnorm is an output array of length n which contains the */
/*         norms of the corresponding columns of the input matrix a. */
/*         if this information is not needed, then acnorm can coincide */
/*         with rdiag. */

/*       wa is a work array of length n. if pivot is false, then wa */
/*         can coincide with rdiag. */

/*     subprograms called */

/*       minpack-supplied ... dpmpar,enorm */

/*       fortran-supplied ... dmax1,dsqrt,min0 */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    (void)lipvt;

/*     epsmch is the machine precision. */

    epsmch = __cminpack_func__(dpmpar)(1);

/*     compute the initial column norms and initialize several arrays. */

    for (j = 0; j < n; ++j) {
	acnorm[j] = __cminpack_func__(enorm)(m, &a[j * lda + 0]);
	rdiag[j] = acnorm[j];
	wa[j] = rdiag[j];
	if (pivot) {
	    ipvt[j] = j+1;
	}
    }

/*     reduce a to r with householder transformations. */

    minmn = min(m,n);
    for (j = 0; j < minmn; ++j) {
	if (pivot) {

/*        bring the column of largest norm into the pivot position. */

            int kmax = j;
            for (k = j; k < n; ++k) {
                if (rdiag[k] > rdiag[kmax]) {
                    kmax = k;
                }
            }
            if (kmax != j) {
                for (i = 0; i < m; ++i) {
                    temp = a[i + j * lda];
                    a[i + j * lda] = a[i + kmax * lda];
                    a[i + kmax * lda] = temp;
                }
                rdiag[kmax] = rdiag[j];
                wa[kmax] = wa[j];
                k = ipvt[j];
                ipvt[j] = ipvt[kmax];
                ipvt[kmax] = k;
            }
        }

/*        compute the householder transformation to reduce the */
/*        j-th column of a to a multiple of the j-th unit vector. */

	ajnorm = __cminpack_func__(enorm)(m - (j+1) + 1, &a[j + j * lda]);
	if (ajnorm != 0.) {
            if (a[j + j * lda] < 0.) {
                ajnorm = -ajnorm;
            }
            for (i = j; i < m; ++i) {
                a[i + j * lda] /= ajnorm;
            }
            a[j + j * lda] += 1;

/*        apply the transformation to the remaining columns */
/*        and update the norms. */

            jp1 = j + 1;
            if (n > jp1) {
                for (k = jp1; k < n; ++k) {
                    sum = 0.;
                    for (i = j; i < m; ++i) {
                        sum += a[i + j * lda] * a[i + k * lda];
                    }
                    temp = sum / a[j + j * lda];
                    for (i = j; i < m; ++i) {
                        a[i + k * lda] -= temp * a[i + j * lda];
                    }
                    if (pivot && rdiag[k] != 0.) {
                        temp = a[j + k * lda] / rdiag[k];
                        /* Computing MAX */
                        d1 = 1 - temp * temp;
                        rdiag[k] *= sqrt((max((real)0.,d1)));
                        /* Computing 2nd power */
                        d1 = rdiag[k] / wa[k];
                        if (p05 * (d1 * d1) <= epsmch) {
                            rdiag[k] = __cminpack_func__(enorm)(m - (j+1), &a[jp1 + k * lda]);
                            wa[k] = rdiag[k];
                        }
                    }
                }
            }
        }
	rdiag[j] = -ajnorm;
    }

/*     last card of subroutine qrfac. */
#endif /* !USE_LAPACK */
}